

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<int>::AddAlreadyReserved(RepeatedField<int> *this,int *value)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *in_RSI;
  int *in_RDI;
  RepeatedField<int> *in_stack_ffffffffffffffe0;
  
  iVar1 = *in_RSI;
  piVar3 = elements(in_stack_ffffffffffffffe0);
  iVar2 = *in_RDI;
  *in_RDI = iVar2 + 1;
  piVar3[iVar2] = iVar1;
  return;
}

Assistant:

inline void RepeatedField<Element>::AddAlreadyReserved(const Element& value) {
  GOOGLE_DCHECK_LT(current_size_, total_size_);
  elements()[current_size_++] = value;
}